

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O3

X509_EXTENSION * X509V3_EXT_nconf(CONF *conf,X509V3_CTX *ctx,char *name,char *value)

{
  char *pcVar1;
  int crit;
  int iVar2;
  X509_EXTENSION *pXVar3;
  char *local_60;
  undefined8 local_58;
  X509 *pXStack_50;
  X509 *local_48;
  X509_REQ *pXStack_40;
  X509_CRL *local_38;
  X509V3_CONF_METHOD *local_30;
  
  if (ctx == (X509V3_CTX *)0x0) {
    ctx = (X509V3_CTX *)&local_58;
    local_48 = (X509 *)0x0;
    pXStack_40 = (X509_REQ *)0x0;
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    pXStack_50 = (X509 *)0x0;
    local_38 = (X509_CRL *)0x0;
    local_30 = (X509V3_CONF_METHOD *)conf;
  }
  local_60 = value;
  crit = v3_check_critical(&local_60);
  iVar2 = v3_check_generic(&local_60);
  if (iVar2 == 0) {
    iVar2 = OBJ_sn2nid(name);
    pcVar1 = local_60;
    pXVar3 = (X509_EXTENSION *)do_ext_nconf((CONF *)conf,(X509V3_CTX *)ctx,iVar2,crit,local_60);
    if (pXVar3 == (X509_EXTENSION *)0x0) {
      pXVar3 = (X509_EXTENSION *)0x0;
      ERR_put_error(0x14,0,0x6e,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                    ,0x3c);
      ERR_add_error_data(4,"name=",name,", value=",pcVar1);
    }
  }
  else {
    pXVar3 = (X509_EXTENSION *)v3_generic_extension(name,local_60,crit,iVar2,(X509V3_CTX *)ctx);
  }
  return pXVar3;
}

Assistant:

X509_EXTENSION *X509V3_EXT_nconf(const CONF *conf, const X509V3_CTX *ctx,
                                 const char *name, const char *value) {
  // If omitted, fill in an empty |X509V3_CTX|.
  X509V3_CTX ctx_tmp;
  if (ctx == NULL) {
    X509V3_set_ctx(&ctx_tmp, NULL, NULL, NULL, NULL, 0);
    X509V3_set_nconf(&ctx_tmp, conf);
    ctx = &ctx_tmp;
  }

  int crit = v3_check_critical(&value);
  int ext_type = v3_check_generic(&value);
  if (ext_type != 0) {
    return v3_generic_extension(name, value, crit, ext_type, ctx);
  }
  X509_EXTENSION *ret = do_ext_nconf(conf, ctx, OBJ_sn2nid(name), crit, value);
  if (!ret) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_ERROR_IN_EXTENSION);
    ERR_add_error_data(4, "name=", name, ", value=", value);
  }
  return ret;
}